

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

void __thiscall spvtools::opt::FoldingRules::AddFoldingRules(FoldingRules *this)

{
  unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
  *this_00;
  FoldingRules *pFVar1;
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  *pvVar2;
  FeatureManager *pFVar3;
  key_type local_60;
  code *local_58 [2];
  code *local_48;
  code *local_40;
  FoldingRules *local_38;
  
  this_00 = &this->rules_;
  local_60.instruction_set = 0x7c;
  local_38 = this;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2200:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2200:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x50;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[1] = (code *)0x0;
  local_58[0] = anon_unknown_0::CompositeExtractFeedingConstruct;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x51;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1820:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1820:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x51;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[1] = (code *)0x0;
  local_58[0] = anon_unknown_0::CompositeConstructFeedingExtract;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x51;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1895:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1895:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x51;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1951:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1951:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x52;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[1] = (code *)0x0;
  local_58[0] = anon_unknown_0::CompositeInsertToCompositeConstruct;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x94;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2540:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2540:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0xf;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2771:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2771:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x81;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2347:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2347:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x81;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1075:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1075:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x81;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1164:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1164:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x81;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1217:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1217:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x81;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1451:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1451:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x81;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1498:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1498:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x88;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2439:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2439:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x88;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:316:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:316:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x88;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:886:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:886:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x88;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:962:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:962:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x88;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1039:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1039:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x85;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2405:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2405:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x85;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:703:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:703:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x85;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:761:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:761:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x85;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:840:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:840:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x7f;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:365:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:365:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x7f;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:466:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:466:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x7f;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:400:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:400:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x83;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2373:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2373:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x83;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1110:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1110:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x83;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1282:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1282:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x83;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1353:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1353:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x80;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2507:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2507:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x80;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1075:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1075:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x80;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1164:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1164:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x80;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1217:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1217:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x80;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1451:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1451:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x80;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1498:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1498:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x84;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1545:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1545:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x84;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:703:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:703:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x84;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:840:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:840:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x82;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1110:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1110:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x82;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1282:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1282:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x82;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1353:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:1353:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0xf5;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2166:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2166:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  pFVar1 = local_38;
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x7e;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:365:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:365:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x7e;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:400:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:400:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x7e;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:466:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:466:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0xa9;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2231:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2231:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x3e;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2615:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2615:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x4f;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2641:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2641:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x57;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x58;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x59;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x5a;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x5b;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x5c;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x5d;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x5e;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x5f;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x60;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x61;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x62;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 99;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x131;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x132;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x133;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x134;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x135;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x136;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x137;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x138;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x139;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x13a;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x13b;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  local_60.instruction_set = 0x140;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_60.instruction_set);
  local_58[0] = (code *)0x0;
  local_58[1] = (code *)0x0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2802:10)>
             ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                     *)local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
  }
  pFVar3 = IRContext::get_feature_mgr(pFVar1->context_);
  local_60.instruction_set = pFVar3->extinst_importid_GLSLstd450_;
  if (local_60.instruction_set != 0) {
    local_60.opcode = 0x2e;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](&pFVar1->ext_rules_,&local_60);
    local_58[0] = (code *)0x0;
    local_58[1] = (code *)0x0;
    local_40 = std::
               _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2471:10)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp:2471:10)>
               ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,(function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
                       *)local_58);
    if (local_48 != (_Manager_type)0x0) {
      (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
    }
  }
  return;
}

Assistant:

void FoldingRules::AddFoldingRules() {
  // Add all folding rules to the list for the opcodes to which they apply.
  // Note that the order in which rules are added to the list matters. If a rule
  // applies to the instruction, the rest of the rules will not be attempted.
  // Take that into consideration.
  rules_[spv::Op::OpBitcast].push_back(BitCastScalarOrVector());

  rules_[spv::Op::OpCompositeConstruct].push_back(
      CompositeExtractFeedingConstruct);

  rules_[spv::Op::OpCompositeExtract].push_back(InsertFeedingExtract());
  rules_[spv::Op::OpCompositeExtract].push_back(
      CompositeConstructFeedingExtract);
  rules_[spv::Op::OpCompositeExtract].push_back(VectorShuffleFeedingExtract());
  rules_[spv::Op::OpCompositeExtract].push_back(FMixFeedingExtract());

  rules_[spv::Op::OpCompositeInsert].push_back(
      CompositeInsertToCompositeConstruct);

  rules_[spv::Op::OpDot].push_back(DotProductDoingExtract());

  rules_[spv::Op::OpEntryPoint].push_back(RemoveRedundantOperands());

  rules_[spv::Op::OpFAdd].push_back(RedundantFAdd());
  rules_[spv::Op::OpFAdd].push_back(MergeAddNegateArithmetic());
  rules_[spv::Op::OpFAdd].push_back(MergeAddAddArithmetic());
  rules_[spv::Op::OpFAdd].push_back(MergeAddSubArithmetic());
  rules_[spv::Op::OpFAdd].push_back(MergeGenericAddSubArithmetic());
  rules_[spv::Op::OpFAdd].push_back(FactorAddMuls());

  rules_[spv::Op::OpFDiv].push_back(RedundantFDiv());
  rules_[spv::Op::OpFDiv].push_back(ReciprocalFDiv());
  rules_[spv::Op::OpFDiv].push_back(MergeDivDivArithmetic());
  rules_[spv::Op::OpFDiv].push_back(MergeDivMulArithmetic());
  rules_[spv::Op::OpFDiv].push_back(MergeDivNegateArithmetic());

  rules_[spv::Op::OpFMul].push_back(RedundantFMul());
  rules_[spv::Op::OpFMul].push_back(MergeMulMulArithmetic());
  rules_[spv::Op::OpFMul].push_back(MergeMulDivArithmetic());
  rules_[spv::Op::OpFMul].push_back(MergeMulNegateArithmetic());

  rules_[spv::Op::OpFNegate].push_back(MergeNegateArithmetic());
  rules_[spv::Op::OpFNegate].push_back(MergeNegateAddSubArithmetic());
  rules_[spv::Op::OpFNegate].push_back(MergeNegateMulDivArithmetic());

  rules_[spv::Op::OpFSub].push_back(RedundantFSub());
  rules_[spv::Op::OpFSub].push_back(MergeSubNegateArithmetic());
  rules_[spv::Op::OpFSub].push_back(MergeSubAddArithmetic());
  rules_[spv::Op::OpFSub].push_back(MergeSubSubArithmetic());

  rules_[spv::Op::OpIAdd].push_back(RedundantIAdd());
  rules_[spv::Op::OpIAdd].push_back(MergeAddNegateArithmetic());
  rules_[spv::Op::OpIAdd].push_back(MergeAddAddArithmetic());
  rules_[spv::Op::OpIAdd].push_back(MergeAddSubArithmetic());
  rules_[spv::Op::OpIAdd].push_back(MergeGenericAddSubArithmetic());
  rules_[spv::Op::OpIAdd].push_back(FactorAddMuls());

  rules_[spv::Op::OpIMul].push_back(IntMultipleBy1());
  rules_[spv::Op::OpIMul].push_back(MergeMulMulArithmetic());
  rules_[spv::Op::OpIMul].push_back(MergeMulNegateArithmetic());

  rules_[spv::Op::OpISub].push_back(MergeSubNegateArithmetic());
  rules_[spv::Op::OpISub].push_back(MergeSubAddArithmetic());
  rules_[spv::Op::OpISub].push_back(MergeSubSubArithmetic());

  rules_[spv::Op::OpPhi].push_back(RedundantPhi());

  rules_[spv::Op::OpSNegate].push_back(MergeNegateArithmetic());
  rules_[spv::Op::OpSNegate].push_back(MergeNegateMulDivArithmetic());
  rules_[spv::Op::OpSNegate].push_back(MergeNegateAddSubArithmetic());

  rules_[spv::Op::OpSelect].push_back(RedundantSelect());

  rules_[spv::Op::OpStore].push_back(StoringUndef());

  rules_[spv::Op::OpVectorShuffle].push_back(VectorShuffleFeedingShuffle());

  rules_[spv::Op::OpImageSampleImplicitLod].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageSampleExplicitLod].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageSampleDrefImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSampleDrefExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSampleProjImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSampleProjExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSampleProjDrefImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSampleProjDrefExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageFetch].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageGather].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageDrefGather].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageRead].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageWrite].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleDrefImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleDrefExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleProjImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleProjExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleProjDrefImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleProjDrefExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseFetch].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageSparseGather].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageSparseDrefGather].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageSparseRead].push_back(UpdateImageOperands());

  FeatureManager* feature_manager = context_->get_feature_mgr();
  // Add rules for GLSLstd450
  uint32_t ext_inst_glslstd450_id =
      feature_manager->GetExtInstImportId_GLSLstd450();
  if (ext_inst_glslstd450_id != 0) {
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FMix}].push_back(
        RedundantFMix());
  }
}